

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

Var Js::JavascriptOperators::NewJavascriptObjectNoArg(ScriptContext *requestContext)

{
  bool bVar1;
  ThreadContext *pTVar2;
  bool bVar3;
  DynamicObject *obj;
  RecyclableObject *obj_00;
  
  pTVar2 = requestContext->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  obj = JavascriptLibrary::CreateObject
                  ((requestContext->super_ScriptContextBase).javascriptLibrary,true,0);
  bVar3 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
  if (bVar3) {
    obj_00 = JavascriptProxy::AutoProxyWrapper(obj);
    obj = VarTo<Js::DynamicObject,Js::RecyclableObject>(obj_00);
  }
  pTVar2->noJsReentrancy = bVar1;
  return obj;
}

Assistant:

Var JavascriptOperators::NewJavascriptObjectNoArg(ScriptContext* requestContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(NewJavascriptObjectNoArg, reentrancylock, requestContext->GetThreadContext());
        DynamicObject * newObject = requestContext->GetLibrary()->CreateObject(true);
        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(newObject));
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
        {
            newObject = VarTo<DynamicObject>(JavascriptProxy::AutoProxyWrapper(newObject));
        }
#endif
        return newObject;
        JIT_HELPER_END(NewJavascriptObjectNoArg);
    }